

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::RemoveExportBuildFileGeneratorCMP0024(cmMakefile *this,cmExportBuildFileGenerator *gen)

{
  __normal_iterator<cmExportBuildFileGenerator_**,_std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>_>
  __position;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<cmExportBuildFileGenerator**,std::vector<cmExportBuildFileGenerator*,std::allocator<cmExportBuildFileGenerator*>>>,__gnu_cxx::__ops::_Iter_equals_val<cmExportBuildFileGenerator*const>>
                         ((this->ExportBuildFileGenerators).
                          super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->ExportBuildFileGenerators).
                          super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  if (__position._M_current !=
      (this->ExportBuildFileGenerators).
      super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>::erase
              (&this->ExportBuildFileGenerators,(const_iterator)__position._M_current);
  }
  return;
}

Assistant:

void cmMakefile::RemoveExportBuildFileGeneratorCMP0024(
    cmExportBuildFileGenerator* gen)
{
  std::vector<cmExportBuildFileGenerator*>::iterator it =
      std::find(this->ExportBuildFileGenerators.begin(),
                this->ExportBuildFileGenerators.end(), gen);
  if(it != this->ExportBuildFileGenerators.end())
    {
    this->ExportBuildFileGenerators.erase(it);
    }
}